

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rounded_box.cxx
# Opt level: O2

void fl_rshadow_box(int x,int y,int w,int h,Fl_Color c)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
  rbox(1,x + 3,y + 3,w,h);
  rbox(0,x + 3,y + 3,w,h);
  fl_rounded_box(x,y,w,h,c);
  return;
}

Assistant:

static void fl_rshadow_box(int x, int y, int w, int h, Fl_Color c) {
  // draw shadow:
  fl_color(FL_DARK3);
  rbox(1, x+BW, y+BW, w, h);
  rbox(0, x+BW, y+BW, w, h);
  // draw the box:
  fl_rounded_box(x, y, w, h, c);
}